

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-access-set.hxx
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
__thiscall
andres::RandomAccessSet<int,_std::less<int>,_std::allocator<int>_>::insert
          (RandomAccessSet<int,_std::less<int>,_std::allocator<int>_> *this,value_type *value)

{
  bool bVar1;
  reference __y;
  undefined8 extraout_RDX;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar2;
  pair<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
  pVar3;
  bool local_91;
  bool local_79;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> local_78;
  value_type local_64;
  const_iterator local_60;
  int *local_58;
  value_type local_4c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  value_type local_3c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  iterator i;
  bool found;
  value_type *value_local;
  RandomAccessSet<int,_std::less<int>,_std::allocator<int>_> *this_local;
  bool local_10;
  
  i._M_current._7_1_ = 1;
  local_3c = *value;
  local_38._M_current = (int *)lower_bound(this,&local_3c);
  local_48._M_current = (int *)end(this);
  bVar1 = __gnu_cxx::operator==(&local_38,&local_48);
  local_91 = true;
  if (!bVar1) {
    local_4c = *value;
    __y = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_38);
    local_91 = std::less<int>::operator()((less<int> *)&this->field_0x18,&local_4c,__y);
  }
  if (local_91 != false) {
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_60,
               &local_38);
    local_64 = *value;
    local_58 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                (&this->vector_,local_60,&local_64);
    i._M_current._7_1_ = 0;
    local_38._M_current = local_58;
  }
  local_79 = (bool)(~i._M_current._7_1_ & 1);
  pVar2 = std::
          make_pair<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>&,bool>
                    (&local_38,&local_79);
  local_78.first = pVar2.first._M_current;
  local_78.second = pVar2.second;
  std::
  pair<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>::
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool,_true>
            ((pair<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
              *)&this_local,&local_78);
  pVar3._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar3.second = local_10;
  pVar3.first._M_current = (int *)this_local;
  return pVar3;
}

Assistant:

inline std::pair<typename RandomAccessSet<Key, Comparison, Allocator>::const_iterator, bool>
RandomAccessSet<Key, Comparison, Allocator>::insert(
    const typename RandomAccessSet<Key, Comparison, Allocator>::value_type& value
) {
    bool found(true);
    iterator i(lower_bound(static_cast<Key>(value)));
    if(i == end() || compare_(static_cast<Key>(value), *i)) {
        i = vector_.insert(i, static_cast<Key>(value));
        found = false;
    }
    return std::make_pair(i, !found);
}